

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerBinaryHelperMemWithTemp2
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,
          JnHelperMethod helperMethodWithTemp)

{
  code *pcVar1;
  bool bVar2;
  OpLayoutType OVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  Instr *pIVar5;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  OVar3 = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
  if (OVar3._value != 4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2289,
                       "(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3)"
                       ,"Expected a binary instruction...");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((*(ushort *)&instr->field_0x36 & 2) != 0) && (instr->m_dst != (Opnd *)0x0)) {
    uStack_38 = CONCAT26((instr->m_dst->m_valueType).field_0.bits,(undefined6)uStack_38);
    bVar2 = ValueType::HasBeenNumber((ValueType *)((long)&uStack_38 + 6));
    if (bVar2) {
      pIVar5 = LoadHelperTemp(this,instr,instr);
      LowerBinaryHelperMem(this,instr,helperMethodWithTemp);
      return pIVar5;
    }
  }
  pIVar5 = LowerBinaryHelperMem(this,instr,helperMethod);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerBinaryHelperMemWithTemp2(
    IR::Instr *instr,
    IR::JnHelperMethod helperMethod,
    IR::JnHelperMethod helperMethodWithTemp
    )
{
    AssertMsg(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3, "Expected a binary instruction...");

    if (instr->dstIsTempNumber && instr->GetDst() && instr->GetDst()->GetValueType().HasBeenNumber())
    {
        IR::Instr * instrFirst = this->LoadHelperTemp(instr, instr);
        this->LowerBinaryHelperMem(instr, helperMethodWithTemp);
        return instrFirst;
    }

    return this->LowerBinaryHelperMem(instr, helperMethod);
}